

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnFunctionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  Result RVar3;
  _Alloc_hider _Var4;
  ulong uVar5;
  size_type sVar6;
  
  sVar6 = name.size_;
  _Var4._M_p = name.data_;
  if (sVar6 == 0) {
    pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    uVar5 = (ulong)func_index;
    pbVar2 = (pOVar1->function_names).names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = 0;
    _Var4._M_p = (pointer)0x0;
    if (uVar5 < (ulong)((long)(pOVar1->function_names).names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
      _Var4._M_p = pbVar2[uVar5]._M_dataplus._M_p;
      sVar6 = pbVar2[uVar5]._M_string_length;
    }
  }
  PrintDetails(this,"   - %d: F <%.*s> func=%u",index,sVar6 & 0xffffffff,_Var4._M_p);
  RVar3 = PrintSymbolFlags(this,flags);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnFunctionSymbol(Index index,
                                             uint32_t flags,
                                             string_view name,
                                             Index func_index) {
  if (name.empty()) {
    name = GetFunctionName(func_index);
  }
  PrintDetails("   - %d: F <" PRIstringview "> func=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), func_index);
  return PrintSymbolFlags(flags);
}